

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall pugi::xml_node::attribute(xml_node *this,char_t *name_)

{
  xml_attribute_struct *pxVar1;
  bool bVar2;
  xml_attribute_struct **ppxVar3;
  
  if (this->_root != (xml_node_struct *)0x0) {
    ppxVar3 = &this->_root->first_attribute;
    while (pxVar1 = *ppxVar3, pxVar1 != (xml_attribute_struct *)0x0) {
      if ((pxVar1->name != (char_t *)0x0) &&
         (bVar2 = impl::anon_unknown_0::strequal(name_,pxVar1->name), bVar2)) {
        return (xml_attribute)pxVar1;
      }
      ppxVar3 = &pxVar1->next_attribute;
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN xml_attribute xml_node::attribute(const char_t* name_) const
	{
		if (!_root) return xml_attribute();

		for (xml_attribute_struct* i = _root->first_attribute; i; i = i->next_attribute)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_attribute(i);
		}

		return xml_attribute();
	}